

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

void __thiscall
std::default_delete<hedg::Client<hedg::Rest_Client>_>::operator()
          (default_delete<hedg::Client<hedg::Rest_Client>_> *this,Client<hedg::Rest_Client> *__ptr)

{
  if (__ptr != (Client<hedg::Rest_Client> *)0x0) {
    hedg::Client<hedg::Rest_Client>::~Client(__ptr);
  }
  operator_delete(__ptr,0x2e8);
  return;
}

Assistant:

FMT_FUNC void assert_fail(const char* file, int line, const char* message) {
  // Use unchecked std::fprintf to avoid triggering another assertion when
  // writing to stderr fails
  std::fprintf(stderr, "%s:%d: assertion failed: %s", file, line, message);
  // Chosen instead of std::abort to satisfy Clang in CUDA mode during device
  // code pass.
  std::terminate();
}